

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

unsigned_long gather_time_entropy(void)

{
  int iVar1;
  undefined1 local_18 [4];
  int gettimeofday_res;
  timeval tv;
  
  iVar1 = gettimeofday((timeval *)local_18,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    return tv.tv_sec;
  }
  __assert_fail("gettimeofday_res == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmexpat/lib/xmlparse.c"
                ,0x36f,"unsigned long gather_time_entropy(void)");
}

Assistant:

static unsigned long
gather_time_entropy(void) {
#  ifdef _WIN32
  FILETIME ft;
  GetSystemTimeAsFileTime(&ft); /* never fails */
  return ft.dwHighDateTime ^ ft.dwLowDateTime;
#  else
  struct timeval tv;
  int gettimeofday_res;

  gettimeofday_res = gettimeofday(&tv, NULL);

#    if defined(NDEBUG)
  (void)gettimeofday_res;
#    else
  assert(gettimeofday_res == 0);
#    endif /* defined(NDEBUG) */

  /* Microseconds time is <20 bits entropy */
  return tv.tv_usec;
#  endif
}